

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

cmStateSnapshot * __thiscall
cmState::CreateBaseSnapshot(cmStateSnapshot *__return_storage_ptr__,cmState *this)

{
  cmLinkedTree<cmStateDetail::SnapshotDataType> *this_00;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *pcVar1;
  cmLinkedTree<cmDefinitions> *this_01;
  bool bVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  iterator it;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  PositionType pos;
  iterator local_40;
  
  this_00 = &this->SnapshotData;
  it.Position = 0;
  it.Tree = this_00;
  local_40 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push(this_00,it);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  (pSVar3->DirectoryParent).Tree = this_00;
  (pSVar3->DirectoryParent).Position = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  (pSVar3->ScopeParent).Tree = this_00;
  (pSVar3->ScopeParent).Position = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar3->SnapshotType = BaseType;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar3->Keep = true;
  iVar5.Position = 0;
  iVar5.Tree = &this->BuildsystemDirectory;
  iVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Push
                    (&this->BuildsystemDirectory,iVar5);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar3->BuildSystemDirectory = iVar5;
  iVar6.Position = 0;
  iVar6.Tree = &this->ExecutionListFiles;
  iVar6 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push(&this->ExecutionListFiles,iVar6);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar3->ExecutionListFile = iVar6;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar3->IncludeDirectoryPosition = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar3->CompileDefinitionsPosition = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar3->CompileOptionsPosition = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar3->LinkOptionsPosition = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pSVar3->LinkDirectoriesPosition = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  (pBVar4->DirectoryEnd).Tree = local_40.Tree;
  (pBVar4->DirectoryEnd).Position = local_40.Position;
  pcVar1 = &this->PolicyStack;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  (pSVar3->Policies).Tree = pcVar1;
  (pSVar3->Policies).Position = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  (pSVar3->PolicyRoot).Tree = pcVar1;
  (pSVar3->PolicyRoot).Position = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  (pSVar3->PolicyScope).Tree = pcVar1;
  (pSVar3->PolicyScope).Position = 0;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  bVar2 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar3->Policies);
  if (!bVar2) {
    __assert_fail("pos->Policies.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x2d8,"cmStateSnapshot cmState::CreateBaseSnapshot()");
  }
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
  bVar2 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::iterator::IsValid(&pSVar3->PolicyRoot);
  if (bVar2) {
    this_01 = &this->VarTree;
    iVar7.Position = 0;
    iVar7.Tree = this_01;
    iVar7 = cmLinkedTree<cmDefinitions>::Push(this_01,iVar7);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
    pSVar3->Vars = iVar7;
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
    bVar2 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar3->Vars);
    if (bVar2) {
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
      (pSVar3->Parent).Tree = this_01;
      (pSVar3->Parent).Position = 0;
      pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_40);
      (pSVar3->Root).Tree = this_01;
      (pSVar3->Root).Position = 0;
      cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,local_40);
      return __return_storage_ptr__;
    }
    __assert_fail("pos->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                  ,0x2db,"cmStateSnapshot cmState::CreateBaseSnapshot()");
  }
  __assert_fail("pos->PolicyRoot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                ,0x2d9,"cmStateSnapshot cmState::CreateBaseSnapshot()");
}

Assistant:

cmStateSnapshot cmState::CreateBaseSnapshot()
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(this->SnapshotData.Root());
  pos->DirectoryParent = this->SnapshotData.Root();
  pos->ScopeParent = this->SnapshotData.Root();
  pos->SnapshotType = cmStateEnums::BaseType;
  pos->Keep = true;
  pos->BuildSystemDirectory =
    this->BuildsystemDirectory.Push(this->BuildsystemDirectory.Root());
  pos->ExecutionListFile =
    this->ExecutionListFiles.Push(this->ExecutionListFiles.Root());
  pos->IncludeDirectoryPosition = 0;
  pos->CompileDefinitionsPosition = 0;
  pos->CompileOptionsPosition = 0;
  pos->LinkOptionsPosition = 0;
  pos->LinkDirectoriesPosition = 0;
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());
  pos->Vars = this->VarTree.Push(this->VarTree.Root());
  assert(pos->Vars.IsValid());
  pos->Parent = this->VarTree.Root();
  pos->Root = this->VarTree.Root();
  return cmStateSnapshot(this, pos);
}